

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2ThreadTest::RenderBuffer::exec(RenderBuffer *this,Thread *t)

{
  ostream *poVar1;
  deUint32 dVar2;
  int iVar3;
  Thread *pTVar4;
  undefined1 local_1b8 [136];
  ios_base local_130 [264];
  
  pTVar4 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar4 != (Thread *)0x0) {
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"Begin -- glClearColor(0.5f, 0.5f, 0.5f, 1.0f)",0x2d);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x1c0))
              (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"clearColor(0.5f, 0.5f, 0.5f, 1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x698);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glClearColor()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"Begin -- glClear(GL_COLOR_BUFFER_BIT)",0x25);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x188))(0x4000);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"clear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x69c);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glClear()",0x10);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glUseProgram(",0x16);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x1680))
              (((this->m_program).m_ptr)->program);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"useProgram(m_program->program)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6a0);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glUseProgram()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glGetAttribLocation(",0x1d);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", \"a_pos\")",10);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    iVar3 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x780))
                      (((this->m_program).m_ptr)->program,"a_pos");
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6a5);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"End -- ",7);
    std::ostream::operator<<(poVar1,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = glGetAttribLocation()",0x18);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Begin -- glEnableVertexAttribArray(",0x23);
    std::ostream::operator<<(poVar1,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x610))(iVar3);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"enableVertexAttribArray(posLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6a9);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glEnableVertexAttribArray()",0x22);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Begin -- glBindBuffer(GL_ARRAY_BUFFER, ",0x27);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x40))
              (0x8892,((this->m_buffer).m_ptr)->buffer);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindBuffer(GL_ARRAY_BUFFER, m_buffer->buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6ad);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glBindBuffer()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Begin -- glVertexAttribPointer(",0x1f);
    std::ostream::operator<<(poVar1,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", GL_BYTE, GL_TRUE, 0, 0)",0x19);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x19f0))(iVar3,2,0x1400,1,0,0);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"vertexAttribPointer(posLoc, 2, GL_BYTE, GL_TRUE, 0, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6b1);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glVertexAttribPointer()",0x1e);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Begin -- glDrawArrays(GL_TRIANGLES, 0, ",0x27);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x538))
              (4,0,(int)((this->m_buffer).m_ptr)->size / 2);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"drawArrays(GL_TRIANGLES, 0, (GLsizei)m_buffer->size / 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6b5);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glDrawArrays()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"Begin -- glBindBuffer(GL_ARRAY_BUFFER, 0)",0x29);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x40))(0x8892,0);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindBuffer(GL_ARRAY_BUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6b9);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glBindBuffer()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Begin -- glDisableVertexAttribArray(",0x24);
    std::ostream::operator<<(poVar1,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x518))(iVar3);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"disableVertexAttribArray(posLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6bd);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glDisableVertexAttribArray()",0x23);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"Begin -- glUseProgram(0)",0x18);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x1680))(0);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"useProgram(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6c1);
    local_1b8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glUseProgram()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void RenderBuffer::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- glClearColor(0.5f, 0.5f, 0.5f, 1.0f)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, clearColor(0.5f, 0.5f, 0.5f, 1.0f));
	thread.newMessage() << "End -- glClearColor()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glClear(GL_COLOR_BUFFER_BIT)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, clear(GL_COLOR_BUFFER_BIT));
	thread.newMessage() << "End -- glClear()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glUseProgram(" << m_program->program << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, useProgram(m_program->program));
	thread.newMessage() << "End -- glUseProgram()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glGetAttribLocation(" << m_program->program << ", \"a_pos\")" << tcu::ThreadUtil::Message::End;
	GLint posLoc = thread.gl.getAttribLocation(m_program->program, "a_pos");
	GLU_CHECK_GLW_MSG(thread.gl, "glGetAttribLocation()");
	thread.newMessage() << "End -- " << posLoc << " = glGetAttribLocation()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glEnableVertexAttribArray(" << posLoc << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, enableVertexAttribArray(posLoc));
	thread.newMessage() << "End -- glEnableVertexAttribArray()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindBuffer(GL_ARRAY_BUFFER, " << m_buffer->buffer << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(GL_ARRAY_BUFFER, m_buffer->buffer));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glVertexAttribPointer(" << posLoc << ", GL_BYTE, GL_TRUE, 0, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, vertexAttribPointer(posLoc, 2, GL_BYTE, GL_TRUE, 0, 0));
	thread.newMessage() << "End -- glVertexAttribPointer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glDrawArrays(GL_TRIANGLES, 0, " << (m_buffer->size / 2) << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, drawArrays(GL_TRIANGLES, 0, (GLsizei)m_buffer->size / 2));
	thread.newMessage() << "End -- glDrawArrays()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindBuffer(GL_ARRAY_BUFFER, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(GL_ARRAY_BUFFER, 0));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glDisableVertexAttribArray(" << posLoc << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, disableVertexAttribArray(posLoc));
	thread.newMessage() << "End -- glDisableVertexAttribArray()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glUseProgram(0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, useProgram(0));
	thread.newMessage() << "End -- glUseProgram()" << tcu::ThreadUtil::Message::End;
}